

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

void QTlsBackend::setupClientPskAuth
               (QSslPreSharedKeyAuthenticator *auth,char *hint,int hintLength,uint maxIdentityLen,
               uint maxPskLen)

{
  long lVar1;
  int iVar2;
  QSslPreSharedKeyAuthenticatorPrivate *pQVar3;
  int in_ECX;
  long in_RSI;
  char *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    QByteArray::fromRawData(in_RDI,in_RSI);
    QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
              ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)
               CONCAT44(in_R8D,in_stack_ffffffffffffffc0));
    QByteArray::operator=
              ((QByteArray *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),
               (QByteArray *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    QByteArray::~QByteArray((QByteArray *)0x27899e);
  }
  iVar2 = in_ECX + -1;
  pQVar3 = QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
                     ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)
                      CONCAT44(in_R8D,in_stack_ffffffffffffffc0));
  pQVar3->maximumIdentityLength = iVar2;
  pQVar3 = QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->
                     ((QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *)
                      CONCAT44(in_R8D,in_R8D));
  pQVar3->maximumPreSharedKeyLength = in_R8D;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTlsBackend::setupClientPskAuth(QSslPreSharedKeyAuthenticator *auth, const char *hint,
                                     int hintLength, unsigned maxIdentityLen, unsigned maxPskLen)
{
    Q_ASSERT(auth);
#if QT_CONFIG(ssl)
    if (hint)
        auth->d->identityHint = QByteArray::fromRawData(hint, hintLength); // it's NUL terminated, but do not include the NUL

    auth->d->maximumIdentityLength = int(maxIdentityLen) - 1; // needs to be NUL terminated
    auth->d->maximumPreSharedKeyLength = int(maxPskLen);
#else
    Q_UNUSED(auth);
    Q_UNUSED(hint);
    Q_UNUSED(hintLength);
    Q_UNUSED(maxIdentityLen);
    Q_UNUSED(maxPskLen);
#endif
}